

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createSpecConstantTests(TestContext *testCtx)

{
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *__return_storage_ptr__;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *__return_storage_ptr___00;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *__return_storage_ptr___01;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *this;
  VkShaderStageFlagBits VVar1;
  DataType dataType;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *this_00;
  DataType specConstId;
  deUint32 dVar2;
  TestCaseGroup *pTVar3;
  TestNode *pTVar4;
  SpecConstantTest *pSVar5;
  TestCaseGroup *pTVar6;
  ostream *poVar7;
  char *pcVar8;
  int iVar9;
  CaseDefinition *__return_storage_ptr___02;
  DataType type;
  DataType type_00;
  uint uVar10;
  OffsetValue *o4;
  StageDef *pSVar11;
  DataType dataType_00;
  long lVar12;
  allocator<char> local_1025;
  allocator<char> local_1024;
  allocator<char> local_1023;
  allocator<char> local_1022;
  allocator<char> local_1021;
  allocator<char> local_1020;
  allocator<char> local_101f;
  allocator<char> local_101e;
  allocator<char> local_101d;
  allocator<char> local_101c;
  allocator<char> local_101b;
  allocator<char> local_101a;
  allocator<char> local_1019;
  allocator<char> local_1018;
  allocator<char> local_1017;
  allocator<char> local_1016;
  allocator<char> local_1015;
  VkShaderStageFlagBits local_1014;
  string *local_1010;
  CaseDefinition *local_1008;
  string *local_1000;
  string *local_ff8;
  string *local_ff0;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_fe8;
  string *local_fe0;
  CaseDefinition *local_fd8;
  CaseDefinition *local_fd0;
  CaseDefinition *local_fc8;
  CaseDefinition *local_fc0;
  CaseDefinition *local_fb8;
  CaseDefinition *local_fb0;
  CaseDefinition *local_fa8;
  CaseDefinition *local_fa0;
  CaseDefinition *local_f98;
  string *local_f90;
  string *local_f88;
  string *local_f80;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_f78;
  string *local_f70;
  string *local_f68;
  string *local_f60;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_f58;
  string *local_f50;
  string *local_f48;
  string *local_f40;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_f38;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_f30;
  CaseDefinition *local_f28;
  CaseDefinition *local_f20;
  CaseDefinition *local_f18;
  CaseDefinition *local_f10;
  CaseDefinition *local_f08;
  allocator<char> local_efa;
  allocator<char> local_ef9;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_2;
  undefined1 local_ec0 [8];
  _Alloc_hider local_eb8;
  deUint32 local_e98;
  GenericValue local_e90;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_e88;
  StageDef *local_e80;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup_4;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  string globalDecl;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> stageGroup;
  OffsetValue local_dd8;
  OffsetValue local_dc8;
  OffsetValue local_db8;
  value_type local_da8;
  value_type local_d98;
  value_type local_d88;
  OffsetValue local_d78;
  OffsetValue local_d68;
  OffsetValue local_d58;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> compositeTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup_2;
  undefined1 local_cd8 [8];
  _Alloc_hider local_cd0;
  deUint32 local_cb0;
  GenericValue local_ca8;
  undefined1 local_ca0 [8];
  _Alloc_hider local_c98;
  deUint32 local_c78;
  GenericValue local_c70;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_3;
  undefined1 local_c30 [40];
  deUint32 local_c08;
  GenericValue local_c00;
  undefined1 local_bf8 [40];
  deUint32 local_bd0;
  GenericValue local_bc8;
  OffsetValue local_bc0;
  OffsetValue local_bb0;
  OffsetValue local_ba0;
  undefined1 local_b90 [8];
  _Alloc_hider local_b88;
  deUint32 local_b68;
  GenericValue local_b60;
  OffsetValue local_b58 [2];
  string local_b38;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_b18;
  long local_b10;
  undefined1 *local_b08;
  SpecConstantTest *local_b00;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup_3;
  OffsetValue local_ab8;
  undefined1 local_aa8 [40];
  deUint32 local_a80;
  GenericValue local_a78;
  OffsetValue local_a70;
  OffsetValue local_a60;
  OffsetValue local_a50;
  OffsetValue local_a40;
  string local_a30;
  string local_a10;
  OffsetValue local_9f0;
  OffsetValue local_9e0;
  OffsetValue local_9d0;
  OffsetValue local_9c0;
  OffsetValue local_9b0 [2];
  string local_990;
  OffsetValue local_970 [2];
  OffsetValue local_950;
  OffsetValue local_940;
  OffsetValue local_930;
  OffsetValue local_920;
  string local_910;
  OffsetValue local_8f0;
  OffsetValue local_8e0;
  OffsetValue local_8d0;
  string local_8c0;
  string local_8a0;
  undefined1 local_880 [32];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_860;
  ulong local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840 [2];
  undefined1 auStack_800 [32];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  vStack_7e0;
  FeatureFlags local_7c8;
  TestNode *local_7c0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_7b8;
  long local_7b0;
  TestNode *local_7a8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> allTests;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_790;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  CaseDefinition defs [5];
  string local_248 [32];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_228;
  undefined8 local_210;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_1a8;
  undefined4 local_190;
  string local_188 [32];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_168;
  undefined8 local_150;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_e8;
  undefined4 local_d0;
  StageDef stages [6];
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"spec_constant","Specialization constants tests")
  ;
  allTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar3;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,testCtx,"graphics","");
  stages[0].name = "vertex";
  stages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  stages[1].name = "fragment";
  stages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  stages[2].name = "tess_control";
  stages[2].stage = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  stages[3].name = "tess_eval";
  stages[3].stage = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
  stages[4].name = "geometry";
  stages[4].stage = VK_SHADER_STAGE_GEOMETRY_BIT;
  stages[5].parentGroup =
       allTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
       .ptr;
  stages[5].name = "compute";
  stages[5].stage = VK_SHADER_STAGE_COMPUTE_BIT;
  local_790.m_data.ptr = (TestCaseGroup *)0x0;
  stages[0].parentGroup = (TestCaseGroup *)pTVar4;
  stages[1].parentGroup = (TestCaseGroup *)pTVar4;
  stages[2].parentGroup = (TestCaseGroup *)pTVar4;
  stages[3].parentGroup = (TestCaseGroup *)pTVar4;
  stages[4].parentGroup = (TestCaseGroup *)pTVar4;
  tcu::TestNode::addChild
            (&(allTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,pTVar4);
  local_1010 = (string *)&defs[0].mainCode;
  local_f30 = &defs[0].expectedValues;
  local_f98 = defs + 1;
  local_f08 = defs + 2;
  local_1008 = defs + 1;
  local_fa0 = defs + 2;
  local_f18 = defs + 1;
  local_fb0 = defs + 1;
  local_fb8 = defs + 2;
  local_b08 = auStack_800;
  local_7b8 = &vStack_7e0;
  local_f20 = defs + 1;
  local_f28 = defs + 2;
  local_f10 = defs + 3;
  local_fa8 = defs + 3;
  local_fc0 = defs + 3;
  local_fd0 = defs + 3;
  local_fc8 = defs + 4;
  local_fd8 = defs + 4;
  local_fe0 = local_248;
  local_fe8 = &defs[1].specConstants;
  local_ff0 = (string *)&defs[1].ssboCode;
  local_ff8 = (string *)&defs[1].globalCode;
  local_1000 = (string *)&defs[1].mainCode;
  local_e88 = &defs[1].expectedValues;
  local_f38 = &defs[2].specConstants;
  local_f40 = (string *)&defs[2].ssboCode;
  local_f48 = (string *)&defs[2].globalCode;
  local_f50 = (string *)&defs[2].mainCode;
  __return_storage_ptr__ = &defs[2].expectedValues;
  local_f58 = &defs[3].specConstants;
  local_f60 = (string *)&defs[3].ssboCode;
  local_f68 = (string *)&defs[3].globalCode;
  local_f70 = (string *)&defs[3].mainCode;
  __return_storage_ptr___00 = &defs[3].expectedValues;
  local_f78 = &defs[4].specConstants;
  local_f80 = (string *)&defs[4].ssboCode;
  local_f88 = (string *)&defs[4].globalCode;
  local_f90 = (string *)&defs[4].mainCode;
  __return_storage_ptr___01 = &defs[4].expectedValues;
  local_b18 = &local_1a8;
  for (local_b10 = 0;
      pTVar3 = allTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, local_b10 != 6; local_b10 = local_b10 + 1) {
    pTVar4 = (TestNode *)operator_new(0x70);
    lVar12 = local_b10;
    pSVar11 = stages + local_b10;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,testCtx,stages[local_b10].name,"");
    VVar1 = stages[lVar12].stage;
    local_e80 = pSVar11;
    stageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)pTVar4;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"default_value","use default constant value");
    testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"bool",(allocator<char> *)&local_8a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_bf8,"layout(constant_id = ${ID}) const bool sc0 = true;",
               (allocator<char> *)&local_8c0);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&group,1,(string *)local_bf8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_aa8,"layout(constant_id = ${ID}) const bool sc1 = false;",
               (allocator<char> *)&testGroup_3);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_880,2,(string *)local_aa8);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group,(SpecConstant *)local_880);
    defs[0].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    bool r0;\n    bool r1;\n",
               (allocator<char> *)&local_910);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,"",(allocator<char> *)&testGroup_1);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",
               (allocator<char> *)&testGroup_4);
    local_b58[0].size = 4;
    local_b58[0].offset = 0;
    local_b58[0].value.m_data = 1;
    local_b38._M_dataplus._M_p = (pointer)0x400000004;
    local_b38._M_string_length = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,local_b58,(OffsetValue *)&local_b38);
    defs[0].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f98,"int",(allocator<char> *)&local_d58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c30,"layout(constant_id = ${ID}) const int sc0 = -3;",
               (allocator<char> *)&local_d68);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_ec0,1,(string *)local_c30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b90,"layout(constant_id = ${ID}) const int sc1 = 17;",
               (allocator<char> *)&local_d78);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&group_2,2,(string *)local_b90);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_fe8,(SpecConstant *)local_ec0,(SpecConstant *)&group_2);
    defs[1].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_ff0,"    int r0;\n    int r1;\n",(allocator<char> *)&local_d88);
    std::__cxx11::string::string<std::allocator<char>>(local_ff8,"",(allocator<char> *)&local_d98);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1000,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",
               (allocator<char> *)&local_da8);
    local_970[0].size = 4;
    local_970[0].offset = 0;
    local_970[0].value.m_data = 0xfffffffd;
    local_990._M_dataplus._M_p = (pointer)0x400000004;
    local_990._M_string_length = 0x11;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_e88,local_970,(OffsetValue *)&local_990);
    defs[1].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f08,"uint",(allocator<char> *)&local_db8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compositeTests,"layout(constant_id = ${ID}) const uint sc0 = 42u;",
               (allocator<char> *)&local_dc8);
    anon_unknown_0::SpecConstant::SpecConstant
              ((SpecConstant *)&testGroup_2,1,(string *)&compositeTests);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f38,(SpecConstant *)&testGroup_2);
    defs[2].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f40,"    uint r0;\n",(allocator<char> *)&local_dd8);
    std::__cxx11::string::string<std::allocator<char>>(local_f48,"",(allocator<char> *)&local_ba0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f50,"    sb_out.r0 = sc0;\n",(allocator<char> *)&local_bb0);
    local_9b0[0].size = 4;
    local_9b0[0].offset = 0;
    local_9b0[0].value.m_data = 0x2a;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(__return_storage_ptr__,local_9b0);
    defs[2].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f10,"float",(allocator<char> *)&local_bc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&group_3,"layout(constant_id = ${ID}) const float sc0 = 7.5;",
               (allocator<char> *)&local_9c0);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_ca0,1,(string *)&group_3);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f58,(SpecConstant *)local_ca0);
    defs[3].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f60,"    float r0;\n",(allocator<char> *)&local_9d0);
    std::__cxx11::string::string<std::allocator<char>>(local_f68,"",(allocator<char> *)&local_9e0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f70,"    sb_out.r0 = sc0;\n",(allocator<char> *)&local_9f0);
    local_a10._M_dataplus._M_p = (pointer)0x4;
    local_a10._M_string_length = 0x40f00000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___00,(OffsetValue *)&local_a10);
    defs[3].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(defs + 4),"double",(allocator<char> *)&local_a40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&globalDecl,"layout(constant_id = ${ID}) const double sc0 = 2.75LF;",
               (allocator<char> *)&local_a50);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_cd8,1,&globalDecl);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f78,(SpecConstant *)local_cd8);
    defs[4].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f80,"    double r0;\n",(allocator<char> *)&local_a60);
    std::__cxx11::string::string<std::allocator<char>>(local_f88,"",(allocator<char> *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f90,"    sb_out.r0 = sc0;\n",(allocator<char> *)&local_ab8);
    local_a30._M_dataplus._M_p = (pointer)0x8;
    local_a30._M_string_length = 0x4006000000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___01,(OffsetValue *)&local_a30);
    defs[4].requirements = 4;
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&globalDecl);
    std::__cxx11::string::~string((string *)&local_c98);
    std::__cxx11::string::~string((string *)&group_3);
    std::__cxx11::string::~string
              ((string *)
               &testGroup_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&compositeTests);
    std::__cxx11::string::~string
              ((string *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)local_b90);
    std::__cxx11::string::~string((string *)&local_eb8);
    std::__cxx11::string::~string((string *)local_c30);
    std::__cxx11::string::~string((string *)(local_880 + 8));
    std::__cxx11::string::~string((string *)local_aa8);
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)local_bf8);
    for (lVar12 = 0;
        pTVar3 = testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar12 != 0x3c0; lVar12 = lVar12 + 0xc0) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,VVar1,
                 (CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
    }
    testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    lVar12 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition
                ((CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0xc0;
    } while (lVar12 != -0xc0);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    tcu::TestNode::addChild(pTVar4,&pTVar3->super_TestNode);
    pTVar3 = stageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    VVar1 = local_e80->stage;
    pTVar6 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar6,testCtx,"basic","specialize a constant");
    testGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"bool",(allocator<char> *)&local_9c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&globalDecl,"layout(constant_id = ${ID}) const bool sc0 = true;",
               (allocator<char> *)&local_9d0);
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)
         CONCAT44(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8,(string *)&globalDecl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testGroup,"layout(constant_id = ${ID}) const bool sc1 = false;",
               (allocator<char> *)&local_9e0);
    local_880._0_4_ = 2;
    std::__cxx11::string::string((string *)(local_880 + 8),(string *)&testGroup);
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,"layout(constant_id = ${ID}) const bool sc2 = true;",
               (allocator<char> *)&local_9f0);
    local_ec0._0_4_ = 3;
    std::__cxx11::string::string((string *)&local_eb8,(string *)local_b58);
    local_e98 = 4;
    local_e90.m_data = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b38,"layout(constant_id = ${ID}) const bool sc3 = false;",
               (allocator<char> *)&local_a40);
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = (TestCaseGroup *)
           CONCAT44(group_2.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr._4_4_,4);
    std::__cxx11::string::string
              ((string *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8,(string *)&local_b38);
    this = &defs[0].specConstants;
    defs[0].specConstants.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    defs[0].specConstants.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    defs[0].specConstants.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::reserve(this,4);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)&group);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_880);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_ec0);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)&group_2);
    defs[0].ssboSize = 0x10;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,
               "    bool r0;\n    bool r1;\n    bool r2;\n    bool r3;\n",
               (allocator<char> *)&local_a50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,"",(allocator<char> *)&local_a60);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,
               "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n    sb_out.r3 = sc3;\n"
               ,(allocator<char> *)&local_a70);
    local_d58.size = 4;
    local_d58.offset = 4;
    local_d58.value.m_data = 0;
    local_d68.size = 4;
    local_d68.offset = 8;
    local_d68.value.m_data = 0;
    testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x4;
    testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    ._8_8_ = 1;
    local_d78.size = 4;
    local_d78.offset = 0xc;
    local_d78.value.m_data = 1;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,(OffsetValue *)&testGroup_4,&local_d58,&local_d68,&local_d78);
    defs[0].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1008,"int",(allocator<char> *)&local_ab8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_970,"layout(constant_id = ${ID}) const int sc0 = -3;",
               (allocator<char> *)&local_8d0);
    testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)
           CONCAT44(testGroup_2.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &testGroup_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8,(string *)local_970);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"layout(constant_id = ${ID}) const int sc1 = 91;",
               (allocator<char> *)&local_8e0);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_ca0,2,&local_990);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_9b0,"layout(constant_id = ${ID}) const int sc2 = 17;",
               (allocator<char> *)&local_8f0);
    local_cd8._0_4_ = 3;
    std::__cxx11::string::string((string *)&local_cd0,(string *)local_9b0);
    local_cb0 = 4;
    local_ca8.m_data = 0xfffffff1;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_fe8,(SpecConstant *)&testGroup_2,(SpecConstant *)local_ca0,
               (SpecConstant *)local_cd8);
    defs[1].ssboSize = 0xc;
    std::__cxx11::string::string<std::allocator<char>>
              (local_ff0,"    int r0;\n    int r1;\n    int r2;\n",(allocator<char> *)&local_920);
    std::__cxx11::string::string<std::allocator<char>>(local_ff8,"",(allocator<char> *)&local_930);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1000,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n",
               (allocator<char> *)&local_940);
    this_00 = local_e88;
    local_d88.size = 4;
    local_d88.offset = 0;
    local_d88.value.m_data = 0x21;
    local_d98.size = 4;
    local_d98.offset = 4;
    local_d98.value.m_data = 0x5b;
    local_da8.size = 4;
    local_da8.offset = 8;
    local_da8.value.m_data = 0xfffffff1;
    (local_e88->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e88->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e88->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::reserve(local_e88,3);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_d88);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_d98);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_da8);
    defs[1].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fa0,"uint",(allocator<char> *)&local_950);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"layout(constant_id = ${ID}) const uint sc0 = 42u;",&local_1015)
    ;
    local_bf8._0_4_ = 1;
    std::__cxx11::string::string((string *)(local_bf8 + 8),(string *)&local_a10);
    local_bd0 = 4;
    local_bc8.m_data = 0x61;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"layout(constant_id = ${ID}) const uint sc1 = 7u;",&local_1016);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_aa8,2,&local_a30);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f38,(SpecConstant *)local_bf8,(SpecConstant *)local_aa8);
    defs[2].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f40,"    uint r0;\n    uint r1;\n",&local_1017);
    std::__cxx11::string::string<std::allocator<char>>(local_f48,"",&local_1018);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f50,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",&local_1019);
    local_db8.size = 4;
    local_db8.offset = 0;
    local_db8.value.m_data = 0x61;
    local_dc8.size = 4;
    local_dc8.offset = 4;
    local_dc8.value.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr__,&local_db8,&local_dc8);
    defs[2].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_fa8,"float",&local_101a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"layout(constant_id = ${ID}) const float sc0 = 7.5;",&local_101b
              );
    local_c30._0_4_ = 1;
    std::__cxx11::string::string((string *)(local_c30 + 8),(string *)&local_8a0);
    local_c08 = 4;
    local_c00.m_data = 0x417c0000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"layout(constant_id = ${ID}) const float sc1 = 1.125;",
               &local_101c);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_b90,2,&local_8c0);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f58,(SpecConstant *)local_c30,(SpecConstant *)local_b90);
    defs[3].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f60,"    float r0;\n    float r1;\n",&local_101d);
    std::__cxx11::string::string<std::allocator<char>>(local_f68,"",&local_101e);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f70,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",&local_101f);
    local_dd8.size = 4;
    local_dd8.offset = 0;
    local_dd8.value.m_data = 0x417c0000;
    local_ba0.size = 4;
    local_ba0.offset = 4;
    local_ba0.value.m_data = 0x3f900000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___00,&local_dd8,&local_ba0);
    defs[3].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)(defs + 4),"double",&local_1020);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testGroup_3,"layout(constant_id = ${ID}) const double sc0 = 2.75LF;",
               &local_1021);
    compositeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)
                 CONCAT44(compositeTests.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &compositeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8,(string *)&testGroup_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_910,"layout(constant_id = ${ID}) const double sc1 = 9.25LF;",
               &local_1022);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&group_3,2,&local_910);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f78,(SpecConstant *)&compositeTests,(SpecConstant *)&group_3);
    defs[4].ssboSize = 0x10;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f80,"    double r0;\n    double r1;\n",&local_1023);
    std::__cxx11::string::string<std::allocator<char>>(local_f88,"",&local_1024);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f90,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",&local_1025);
    local_bb0.size = 8;
    local_bb0.offset = 0;
    local_bb0.value.m_data = 0x4036800000000000;
    local_bc0.size = 8;
    local_bc0.offset = 8;
    local_bc0.value.m_data = 0x4022800000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___01,&local_bb0,&local_bc0);
    defs[4].requirements = 4;
    std::__cxx11::string::~string
              ((string *)
               &group_3.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&local_910);
    std::__cxx11::string::~string
              ((string *)
               &compositeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&testGroup_3);
    std::__cxx11::string::~string((string *)&local_b88);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)(local_c30 + 8));
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)(local_aa8 + 8));
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::~string((string *)(local_bf8 + 8));
    std::__cxx11::string::~string((string *)&local_a10);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)local_9b0);
    std::__cxx11::string::~string((string *)&local_c98);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::~string
              ((string *)
               &testGroup_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)local_970);
    std::__cxx11::string::~string
              ((string *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&local_b38);
    std::__cxx11::string::~string((string *)&local_eb8);
    std::__cxx11::string::~string((string *)local_b58);
    std::__cxx11::string::~string((string *)(local_880 + 8));
    std::__cxx11::string::~string((string *)&testGroup);
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)&globalDecl);
    for (lVar12 = 0;
        pTVar6 = testGroup_1.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar12 != 0x3c0; lVar12 = lVar12 + 0xc0) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,VVar1,
                 (CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      tcu::TestNode::addChild(&pTVar6->super_TestNode,(TestNode *)pSVar5);
    }
    testGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    lVar12 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition
                ((CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0xc0;
    } while (lVar12 != -0xc0);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&testGroup_1.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,&pTVar6->super_TestNode);
    pTVar3 = stageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    VVar1 = local_e80->stage;
    pTVar6 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar6,testCtx,"builtin","built-in override");
    testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"default",(allocator<char> *)local_bf8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_ec0,"layout(constant_id = ${ID}) gl_MaxImageUnits;",
               (allocator<char> *)local_aa8);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&group,1,(string *)local_ec0);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group);
    defs[0].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    bool ok;\n",(allocator<char> *)local_c30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,"",(allocator<char> *)local_b90);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,"    sb_out.ok = (gl_MaxImageUnits >= 8);\n",
               (allocator<char> *)&compositeTests);
    local_ca0 = (undefined1  [8])0x4;
    local_c98._M_p = (pointer)0x1;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,(OffsetValue *)local_ca0);
    defs[0].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f18,"specialized",(allocator<char> *)&group_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&group_2,"layout(constant_id = ${ID}) gl_MaxImageUnits;",
               (allocator<char> *)&globalDecl);
    local_880._0_4_ = 1;
    std::__cxx11::string::string((string *)(local_880 + 8),(string *)&group_2);
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_fe8,(SpecConstant *)local_880);
    defs[1].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_ff0,"    int maxImageUnits;\n",(allocator<char> *)&testGroup);
    std::__cxx11::string::string<std::allocator<char>>(local_ff8,"",(allocator<char> *)local_b58);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1000,"    sb_out.maxImageUnits = gl_MaxImageUnits;\n",
               (allocator<char> *)&local_b38);
    local_cd8 = (undefined1  [8])0x4;
    local_cd0._M_p = (pointer)0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_e88,(OffsetValue *)local_cd8);
    defs[1].requirements = 0;
    std::__cxx11::string::~string((string *)(local_880 + 8));
    std::__cxx11::string::~string((string *)&group_2);
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)local_ec0);
    for (lVar12 = 0;
        pTVar6 = testGroup_2.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar12 != 0x180; lVar12 = lVar12 + 0xc0) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,VVar1,
                 (CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      tcu::TestNode::addChild(&pTVar6->super_TestNode,(TestNode *)pSVar5);
    }
    testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    lVar12 = 0xc0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition
                ((CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0xc0;
    } while (lVar12 != -0xc0);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&testGroup_2.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,&pTVar6->super_TestNode);
    pTVar3 = stageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    VVar1 = local_e80->stage;
    pTVar6 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar6,testCtx,"expression","specialization constants usage in expressions");
    testGroup_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"spec_const_expression",(allocator<char> *)&local_ba0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&group_3,"layout(constant_id = ${ID}) const int sc0 = 2;",
               (allocator<char> *)&local_bb0);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&group,1,(string *)&group_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&globalDecl,"layout(constant_id = ${ID}) const int sc1 = 3;",
               (allocator<char> *)&local_bc0);
    local_880._0_4_ = 2;
    std::__cxx11::string::string((string *)(local_880 + 8),(string *)&globalDecl);
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x5;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group,(SpecConstant *)local_880);
    defs[0].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    int result;\n",(allocator<char> *)&local_9c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,
               "const int expr0 = sc0 + 1;\nconst int expr1 = sc0 + sc1;\n",
               (allocator<char> *)&local_9d0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,"    sb_out.result = expr0 + expr1;\n",(allocator<char> *)&local_9e0);
    local_910._M_dataplus._M_p = (pointer)0x4;
    local_910._M_string_length = 10;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,(OffsetValue *)&local_910);
    defs[0].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fb0,"array_size",(allocator<char> *)&local_9f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testGroup,"layout(constant_id = ${ID}) const int sc0 = 1;",
               (allocator<char> *)&local_a40);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_ec0,1,(string *)&testGroup);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,"layout(constant_id = ${ID}) const int sc1 = 2;",
               (allocator<char> *)&local_a50);
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = (TestCaseGroup *)
           CONCAT44(group_2.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr._4_4_,2);
    std::__cxx11::string::string
              ((string *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8,(string *)local_b58);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_fe8,(SpecConstant *)local_ec0,(SpecConstant *)&group_2);
    defs[1].ssboSize = 0x10;
    std::__cxx11::string::string<std::allocator<char>>
              (local_ff0,"    int r0;\n    int r1[3];\n",(allocator<char> *)&local_a60);
    std::__cxx11::string::string<std::allocator<char>>(local_ff8,"",(allocator<char> *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1000,
               "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = sc0 - i;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = sc1 - i;\n\n    sb_out.r0 = a0[0];\n    for (int i = 0; i < sc1; ++i)\n\t     sb_out.r1[i] = a1[i];\n"
               ,(allocator<char> *)&local_ab8);
    testGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x4;
    testGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    ._8_8_ = 1;
    testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x400000004;
    testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    ._8_8_ = 3;
    local_d58.size = 4;
    local_d58.offset = 8;
    local_d58.value.m_data = 2;
    local_d68.size = 4;
    local_d68.offset = 0xc;
    local_d68.value.m_data = 1;
    o4 = &local_d68;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_e88,(OffsetValue *)&testGroup_1,(OffsetValue *)&testGroup_4,&local_d58,o4);
    defs[1].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fb8,"array_size_expression",(allocator<char> *)&local_8d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b38,"layout(constant_id = ${ID}) const int sc0 = 3;",
               (allocator<char> *)&local_8e0);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)&testGroup_2,1,&local_b38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_970,"layout(constant_id = ${ID}) const int sc1 = 5;",
               (allocator<char> *)&local_8f0);
    local_ca0._0_4_ = 2;
    std::__cxx11::string::string((string *)&local_c98,(string *)local_970);
    local_c78 = 4;
    local_c70.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f38,(SpecConstant *)&testGroup_2,(SpecConstant *)local_ca0);
    defs[2].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f40,"    int r0;\n    int r1;\n",(allocator<char> *)&local_920);
    std::__cxx11::string::string<std::allocator<char>>(local_f48,"",(allocator<char> *)&local_930);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f50,
               "    int a0[sc0 + 3];\n    int a1[sc0 + sc1];\n\n    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
               ,(allocator<char> *)&local_940);
    local_d78.size = 4;
    local_d78.offset = 0;
    local_d78.value.m_data = 0xfffffffe;
    local_d88.size = 4;
    local_d88.offset = 4;
    local_d88.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr__,&local_d78,&local_d88);
    defs[2].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fc0,"array_size_spec_const_expression",(allocator<char> *)&local_950)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"layout(constant_id = ${ID}) const int sc0 = 3;",&local_1015);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_cd8,1,&local_990);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_9b0,"layout(constant_id = ${ID}) const int sc1 = 5;",&local_1016);
    local_bf8._0_4_ = 2;
    std::__cxx11::string::string((string *)(local_bf8 + 8),(string *)local_9b0);
    local_bd0 = 4;
    local_bc8.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f58,(SpecConstant *)local_cd8,(SpecConstant *)local_bf8);
    defs[3].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f60,"    int r0;\n    int r1;\n",&local_1017);
    std::__cxx11::string::string<std::allocator<char>>(local_f68,"",&local_1018);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f70,
               "    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    int a0[size0];\n    int a1[size1];\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
               ,&local_1019);
    local_d98.size = 4;
    local_d98.offset = 0;
    local_d98.value.m_data = 0xfffffffe;
    local_da8.size = 4;
    local_da8.offset = 4;
    local_da8.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___00,&local_d98,&local_da8);
    defs[3].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fc8,"array_size_length",&local_101a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"layout(constant_id = ${ID}) const int sc0 = 1;",&local_101b);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_aa8,1,&local_a10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"layout(constant_id = ${ID}) const int sc1 = 2;",&local_101c);
    local_c30._0_4_ = 2;
    std::__cxx11::string::string((string *)(local_c30 + 8),(string *)&local_a30);
    local_c08 = 4;
    local_c00.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_f78,(SpecConstant *)local_aa8,(SpecConstant *)local_c30);
    defs[4].ssboSize = 8;
    std::__cxx11::string::string<std::allocator<char>>
              (local_f80,"    int r0;\n    int r1;\n",&local_101d);
    std::__cxx11::string::string<std::allocator<char>>(local_f88,"",&local_101e);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f90,
               "    int a0[sc0];\n    int a1[sc1];\n\n    sb_out.r0 = a0.length();\n    sb_out.r1 = a1.length();\n"
               ,&local_101f);
    local_db8.size = 4;
    local_db8.offset = 0;
    local_db8.value.m_data = 1;
    local_dc8.size = 4;
    local_dc8.offset = 4;
    local_dc8.value.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (__return_storage_ptr___01,&local_db8,&local_dc8);
    defs[4].requirements = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (local_248,"array_size_pass_to_function",&local_1020);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"layout(constant_id = ${ID}) const int sc0 = 3;",&local_1021);
    anon_unknown_0::SpecConstant::SpecConstant((SpecConstant *)local_b90,1,&local_8a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"layout(constant_id = ${ID}) const int sc1 = 1;",&local_1022);
    compositeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)
                 CONCAT44(compositeTests.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.ptr._4_4_,2);
    std::__cxx11::string::string
              ((string *)
               &compositeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8,(string *)&local_8c0);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&local_228,(SpecConstant *)local_b90,(SpecConstant *)&compositeTests);
    local_210 = 4;
    std::__cxx11::string::string<std::allocator<char>>(local_208,"    int result;\n",&local_1023);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1e8,
               "int sumArrays (int a0[sc0], int a1[sc1])\n{\n    int sum = 0;\n    for (int i = 0; (i < sc0) && (i < sc1); ++i)\n        sum += a0[i] + a1[i];\n    return sum;\n}\n"
               ,&local_1024);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1c8,
               "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = i + 1;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = i + 2;\n\n    sb_out.result = sumArrays(a0, a1);\n"
               ,&local_1025);
    local_dd8.size = 4;
    local_dd8.offset = 0;
    local_dd8.value.m_data = 0xf;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_b18,&local_dd8);
    local_190 = 0;
    std::__cxx11::string::~string
              ((string *)
               &compositeTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_b88);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)(local_c30 + 8));
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::~string((string *)(local_aa8 + 8));
    std::__cxx11::string::~string((string *)&local_a10);
    std::__cxx11::string::~string((string *)(local_bf8 + 8));
    std::__cxx11::string::~string((string *)local_9b0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::~string((string *)&local_c98);
    std::__cxx11::string::~string((string *)local_970);
    std::__cxx11::string::~string
              ((string *)
               &testGroup_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&local_b38);
    std::__cxx11::string::~string
              ((string *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)local_b58);
    std::__cxx11::string::~string((string *)&local_eb8);
    std::__cxx11::string::~string((string *)&testGroup);
    std::__cxx11::string::~string((string *)(local_880 + 8));
    std::__cxx11::string::~string((string *)&globalDecl);
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)&group_3);
    for (lVar12 = 0;
        pTVar6 = testGroup_3.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar12 != 0x480; lVar12 = lVar12 + 0xc0) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,VVar1,
                 (CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      tcu::TestNode::addChild(&pTVar6->super_TestNode,(TestNode *)pSVar5);
    }
    testGroup_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    lVar12 = 0x3c0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition
                ((CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0xc0;
    } while (lVar12 != -0xc0);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&testGroup_3.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,&pTVar6->super_TestNode);
    local_7c0 = &(stageGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr)->super_TestNode;
    local_1014 = local_e80->stage;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar3,testCtx,"composite","specialization constants usage in composite types");
    compositeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"vector","");
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar3;
    for (lVar12 = 0;
        pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr, lVar12 != 0x3c; lVar12 = lVar12 + 4) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                (defs,*(DataType *)((long)&DAT_00957c40 + lVar12));
      anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar5,testCtx,local_1014,defs);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
      anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    }
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(compositeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               );
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"matrix","");
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar3;
    for (lVar12 = 0;
        pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr, lVar12 != 0x48; lVar12 = lVar12 + 4) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                (defs,*(DataType *)((long)&DAT_00957c80 + lVar12));
      anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar5,testCtx,local_1014,defs);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
      anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    }
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(compositeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               );
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    __return_storage_ptr___02 = (CaseDefinition *)0x93caf3;
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"array","");
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = pTVar3;
    for (lVar12 = 0;
        pTVar3 = group_2.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, iVar9 = (int)__return_storage_ptr___02, lVar12 != 0x98;
        lVar12 = lVar12 + 4) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      __return_storage_ptr___02 = defs;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (__return_storage_ptr___02,
                 (anon_unknown_0 *)(ulong)*(uint *)((long)&DAT_00957cd0 + lVar12),TYPE_INVALID,iVar9
                 ,(int)o4);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,local_1014,__return_storage_ptr___02);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
      anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    }
    for (lVar12 = 0;
        pTVar3 = group_2.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, iVar9 = (int)__return_storage_ptr___02, lVar12 != 0x98;
        lVar12 = lVar12 + 4) {
      pSVar5 = (SpecConstantTest *)operator_new(0x138);
      __return_storage_ptr___02 = defs;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (__return_storage_ptr___02,
                 (anon_unknown_0 *)(ulong)*(uint *)((long)&DAT_00957cd0 + lVar12),TYPE_FLOAT_VEC2,
                 iVar9,(int)o4);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar5,testCtx,local_1014,__return_storage_ptr___02);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
      anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"struct",(allocator<char> *)local_ca0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_bf8,"layout(constant_id = ${ID}) const int   sc0 = 1;",
               (allocator<char> *)local_cd8);
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)
         CONCAT44(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8,(string *)local_bf8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_aa8,"layout(constant_id = ${ID}) const float sc1 = 1.0;",
               (allocator<char> *)local_b90);
    local_880._0_4_ = 2;
    std::__cxx11::string::string((string *)(local_880 + 8),(string *)local_aa8);
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
    local_860.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x40a00000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c30,"layout(constant_id = ${ID}) const bool  sc2 = true;",
               (allocator<char> *)&group_3);
    local_ec0._0_4_ = 3;
    std::__cxx11::string::string((string *)&local_eb8,(string *)local_c30);
    local_e98 = 4;
    local_e90.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group,(SpecConstant *)local_880,
               (SpecConstant *)local_ec0);
    defs[0].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    int result;\n",(allocator<char> *)&globalDecl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,
               "struct Data {\n    int   x;\n    float y;\n    bool  z;\n};\n\nData a0[3] = Data[3](Data(sc0, 2.0, true), Data(1, sc1, true), Data(1, 2.0, sc2));\n"
               ,(allocator<char> *)&testGroup);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,
               "    int sum_a0 = 0;\n\n    for (int i = 0; i < 3; ++i)\n        sum_a0 += int(a0[i].x) + int(a0[i].y) + int(a0[i].z);\n\n    sb_out.result = sum_a0;\n"
               ,(allocator<char> *)local_b58);
    testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x4;
    testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    ._8_8_ = 0x10;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,(OffsetValue *)&testGroup_2);
    defs[0].requirements = 0;
    std::__cxx11::string::~string((string *)&local_eb8);
    std::__cxx11::string::~string((string *)local_c30);
    std::__cxx11::string::~string((string *)(local_880 + 8));
    std::__cxx11::string::~string((string *)local_aa8);
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)local_bf8);
    pTVar3 = group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    pSVar5 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar5,testCtx,local_1014,defs);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
    anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    pTVar3 = group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(compositeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&group_2.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"struct","");
    lVar12 = 0;
    group_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = pTVar3;
    while (pTVar3 = group_3.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr, lVar12 != 0x98) {
      local_b00 = (SpecConstantTest *)operator_new(0x138);
      dataType = *(DataType *)((long)&DAT_00957cd0 + lVar12);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)defs);
      poVar7 = std::operator<<((ostream *)defs,"struct Data {\n");
      poVar7 = std::operator<<(poVar7,"    int   i;\n");
      poVar7 = std::operator<<(poVar7,"    float f;\n");
      poVar7 = std::operator<<(poVar7,"    bool  b;\n");
      poVar7 = std::operator<<(poVar7,"    ");
      pcVar8 = glu::getDataTypeName(dataType);
      poVar7 = std::operator<<(poVar7,pcVar8);
      poVar7 = std::operator<<(poVar7," sc;\n");
      poVar7 = std::operator<<(poVar7,"    uint  ui;\n");
      poVar7 = std::operator<<(poVar7,"};\n");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"Data s0 = Data(3, 2.0, true, ");
      pcVar8 = glu::getDataTypeName(dataType);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::operator<<(poVar7,"(sc0), 8u);\n");
      specConstId = glu::getDataTypeScalarType(dataType);
      local_7a8 = &pTVar3->super_TestNode;
      type_00 = TYPE_DOUBLE_MAT3X4;
      dataType_00 = specConstId;
      if (specConstId == TYPE_BOOL) {
        type_00 = TYPE_INVALID;
        dataType_00 = TYPE_INT;
      }
      local_7b0 = lVar12;
      pcVar8 = glu::getDataTypeName(dataType_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&group_2,pcVar8,(allocator<char> *)&group);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
      poVar7 = std::operator<<((ostream *)&group,"    ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7," sum_s0 = ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(0);\n");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    sum_s0 += ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(s0.i);\n");
      poVar7 = std::operator<<(poVar7,"    sum_s0 += ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(s0.f);\n");
      poVar7 = std::operator<<(poVar7,"    sum_s0 += ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(s0.b);\n");
      poVar7 = std::operator<<(poVar7,"    sum_s0 += ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(s0.sc");
      (anonymous_namespace)::composite_case_internal::getFirstDataElementSubscriptString_abi_cxx11_
                ((string *)local_ec0,(composite_case_internal *)(ulong)dataType,type);
      poVar7 = std::operator<<(poVar7,(string *)local_ec0);
      poVar7 = std::operator<<(poVar7,");\n");
      poVar7 = std::operator<<(poVar7,"    sum_s0 += ");
      poVar7 = std::operator<<(poVar7,(string *)&group_2);
      poVar7 = std::operator<<(poVar7,"(s0.ui);\n");
      poVar7 = std::operator<<(poVar7,"\n");
      std::operator<<(poVar7,"    sb_out.result = sum_s0;\n");
      std::__cxx11::string::~string((string *)local_ec0);
      pcVar8 = glu::getDataTypeName(dataType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testGroup_2,pcVar8,(allocator<char> *)local_ec0);
      std::__cxx11::string::string((string *)local_880,(string *)&testGroup_2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_ca0,"sc0",(allocator<char> *)&globalDecl);
      anon_unknown_0::composite_case_internal::makeSpecConstant
                ((SpecConstant *)local_ec0,(string *)local_ca0,specConstId,type_00,(int)o4);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&local_860,(SpecConstant *)local_ec0);
      dVar2 = anon_unknown_0::composite_case_internal::getDataTypeScalarSizeBytes(dataType_00);
      local_848 = (ulong)dVar2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd8,
                     "    ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &group_2);
      std::operator+(local_840,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd8,
                     " result;\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_b90._0_4_ =
           anon_unknown_0::composite_case_internal::getDataTypeScalarSizeBytes(dataType);
      uVar10 = type_00 + TYPE_DOUBLE;
      if (specConstId == TYPE_FLOAT) {
        local_b88._M_p = (pointer)(ulong)(uint)(float)uVar10;
      }
      else if (specConstId == TYPE_DOUBLE) {
        local_b88._M_p = (pointer)(double)uVar10;
      }
      else {
        local_b88._M_p = (pointer)(ulong)uVar10;
      }
      local_b90._4_4_ = 0;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_7b8,(OffsetValue *)local_b90);
      local_7c8 = (uint)(specConstId == TYPE_DOUBLE) << 2;
      std::__cxx11::string::~string((string *)local_cd8);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)local_ca0);
      std::__cxx11::string::~string((string *)&testGroup_2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
      std::__cxx11::string::~string((string *)&group_2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)defs);
      pSVar5 = local_b00;
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (local_b00,testCtx,local_1014,(CaseDefinition *)local_880);
      tcu::TestNode::addChild(local_7a8,(TestNode *)pSVar5);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_880);
      lVar12 = local_7b0 + 4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"array",(allocator<char> *)&group_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_880,"layout(constant_id = ${ID}) const float sc0 = 1.0;",
               (allocator<char> *)&testGroup_2);
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)
         CONCAT44(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8,(string *)local_880);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group);
    defs[0].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    float result;\n",(allocator<char> *)local_ca0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,
               "struct Data {\n    int  i;\n    vec3 sc[3];\n    bool b;\n};\n\nData s0 = Data(1, vec3[3](vec3(2.0), vec3(sc0), vec3(4.0)), false);\n"
               ,(allocator<char> *)local_cd8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,
               "    float sum_s0 = 0;\n\n    sum_s0 += float(s0.i);\n    sum_s0 += float(s0.sc[0][0]);\n    sum_s0 += float(s0.sc[1][0]);\n    sum_s0 += float(s0.sc[2][0]);\n    sum_s0 += float(s0.b);\n\n    sb_out.result = sum_s0;\n"
               ,(allocator<char> *)local_b90);
    local_ec0 = (undefined1  [8])0x4;
    local_eb8._M_p = (pointer)0x42180000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f30,(OffsetValue *)local_ec0);
    defs[0].requirements = 0;
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)local_880);
    pTVar3 = group_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    pSVar5 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar5,testCtx,local_1014,defs);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
    anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)defs,"struct",(allocator<char> *)&testGroup_2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_ec0,"layout(constant_id = ${ID}) const int sc0 = 1;",
               (allocator<char> *)local_ca0);
    group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)
         CONCAT44(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr._4_4_,1);
    std::__cxx11::string::string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8,(string *)local_ec0);
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (&defs[0].specConstants,(SpecConstant *)&group);
    defs[0].ssboSize = 4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].ssboCode,"    int result;\n",(allocator<char> *)local_cd8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defs[0].globalCode,
               "struct Nested {\n    vec2  v;\n    int   sc;\n    float f;\n};\n\nstruct Data {\n    uint   ui;\n    Nested s;\n    bool   b;\n};\n\nData s0 = Data(1u, Nested(vec2(2.0), sc0, 4.0), true);\n"
               ,(allocator<char> *)local_b90);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1010,
               "    int sum_s0 = 0;\n\n    sum_s0 += int(s0.ui);\n    sum_s0 += int(s0.s.v[0]);\n    sum_s0 += int(s0.s.sc);\n    sum_s0 += int(s0.s.f);\n    sum_s0 += int(s0.b);\n\n    sb_out.result = sum_s0;\n"
               ,(allocator<char> *)&globalDecl);
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = (TestCaseGroup *)0x4;
    group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _8_8_ = 0x13;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_f30,(OffsetValue *)&group_2)
    ;
    defs[0].requirements = 0;
    std::__cxx11::string::~string
              ((string *)
               &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.field_0x8);
    std::__cxx11::string::~string((string *)local_ec0);
    pTVar3 = group_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    pSVar5 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar5,testCtx,local_1014,defs);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar5);
    anon_unknown_0::CaseDefinition::~CaseDefinition(defs);
    pTVar3 = group_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    group_3.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
         = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(compositeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&group_3.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    pTVar3 = compositeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    compositeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&compositeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    tcu::TestNode::addChild(local_7c0,&pTVar3->super_TestNode);
    pTVar3 = stageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if (local_1014 == VK_SHADER_STAGE_COMPUTE_BIT) {
      pTVar6 = (TestCaseGroup *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                (pTVar6,testCtx,"local_size","work group size specialization");
      testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar6;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&group_3,"    uvec3 workGroupSize;\n    uint  checksum;\n",
                 (allocator<char> *)defs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&globalDecl,"shared uint count;\n",(allocator<char> *)defs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testGroup,
                 "    count = 0u;\n\n    groupMemoryBarrier();\n    barrier();\n\n    atomicAdd(count, 1u);\n\n    groupMemoryBarrier();\n    barrier();\n\n    sb_out.workGroupSize = gl_WorkGroupSize;\n    sb_out.checksum      = count;\n"
                 ,(allocator<char> *)defs);
      std::__cxx11::string::string<std::allocator<char>>((string *)defs,"x",&local_1015);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b58,"layout(local_size_x_id = ${ID}) in;",&local_1016);
      group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
           = (TestCaseGroup *)
             CONCAT44(group.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.ptr._4_4_,1);
      std::__cxx11::string::string
                ((string *)
                 &group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(string *)local_b58);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&defs[0].specConstants,(SpecConstant *)&group);
      defs[0].ssboSize = 0x10;
      std::__cxx11::string::string((string *)&defs[0].ssboCode,(string *)&group_3);
      std::__cxx11::string::string((string *)&defs[0].globalCode,(string *)&globalDecl);
      std::__cxx11::string::string(local_1010,(string *)&testGroup);
      local_d58.size = 4;
      local_d58.offset = 0;
      local_d58.value.m_data = 7;
      local_d68.size = 4;
      local_d68.offset = 4;
      local_d68.value.m_data = 1;
      local_d78.size = 4;
      local_d78.offset = 8;
      local_d78.value.m_data = 1;
      local_d88.size = 4;
      local_d88.offset = 0xc;
      local_d88.value.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_f30,&local_d58,&local_d68,&local_d78,&local_d88);
      defs[0].requirements = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_f20,"y",&local_1017);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b38,"layout(local_size_y_id = ${ID}) in;",&local_1018);
      local_880._0_4_ = 1;
      std::__cxx11::string::string((string *)(local_880 + 8),(string *)&local_b38);
      local_860.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
      local_860.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_fe8,(SpecConstant *)local_880);
      defs[1].ssboSize = 0x10;
      std::__cxx11::string::string(local_ff0,(string *)&group_3);
      std::__cxx11::string::string(local_ff8,(string *)&globalDecl);
      std::__cxx11::string::string(local_1000,(string *)&testGroup);
      local_d98.size = 4;
      local_d98.offset = 0;
      local_d98.value.m_data = 1;
      local_da8.size = 4;
      local_da8.offset = 4;
      local_da8.value.m_data = 5;
      local_db8.size = 4;
      local_db8.offset = 8;
      local_db8.value.m_data = 1;
      local_dc8.size = 4;
      local_dc8.offset = 0xc;
      local_dc8.value.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_e88,&local_d98,&local_da8,&local_db8,&local_dc8);
      defs[1].requirements = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_f28,"z",&local_1019);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_970,"layout(local_size_z_id = ${ID}) in;",&local_101a);
      local_ec0._0_4_ = 1;
      std::__cxx11::string::string((string *)&local_eb8,(string *)local_970);
      local_e98 = 4;
      local_e90.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_f38,(SpecConstant *)local_ec0);
      defs[2].ssboSize = 0x10;
      std::__cxx11::string::string(local_f40,(string *)&group_3);
      std::__cxx11::string::string(local_f48,(string *)&globalDecl);
      std::__cxx11::string::string(local_f50,(string *)&testGroup);
      local_dd8.size = 4;
      local_dd8.offset = 0;
      local_dd8.value.m_data = 1;
      local_ba0.size = 4;
      local_ba0.offset = 4;
      local_ba0.value.m_data = 1;
      local_bb0.size = 4;
      local_bb0.offset = 8;
      local_bb0.value.m_data = 3;
      local_bc0.size = 4;
      local_bc0.offset = 0xc;
      local_bc0.value.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (__return_storage_ptr__,&local_dd8,&local_ba0,&local_bb0,&local_bc0);
      defs[2].requirements = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_fd0,"xy",&local_101b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_990,"layout(local_size_x_id = ${ID}) in;",&local_101c);
      group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
      ptr = (TestCaseGroup *)
            CONCAT44(group_2.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr._4_4_,1);
      std::__cxx11::string::string
                ((string *)
                 &group_2.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(string *)&local_990);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_9b0,"layout(local_size_y_id = ${ID}) in;",&local_101d);
      testGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)
                   CONCAT44(testGroup_2.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data.ptr._4_4_,2);
      std::__cxx11::string::string
                ((string *)
                 &testGroup_2.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(string *)local_9b0);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_f58,(SpecConstant *)&group_2,(SpecConstant *)&testGroup_2);
      defs[3].ssboSize = 0x10;
      std::__cxx11::string::string(local_f60,(string *)&group_3);
      std::__cxx11::string::string(local_f68,(string *)&globalDecl);
      std::__cxx11::string::string(local_f70,(string *)&testGroup);
      local_9c0.size = 4;
      local_9c0.offset = 0;
      local_9c0.value.m_data = 6;
      local_9d0.size = 4;
      local_9d0.offset = 4;
      local_9d0.value.m_data = 4;
      local_9e0.size = 4;
      local_9e0.offset = 8;
      local_9e0.value.m_data = 1;
      local_9f0.size = 4;
      local_9f0.offset = 0xc;
      local_9f0.value.m_data = 0x18;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (__return_storage_ptr___00,&local_9c0,&local_9d0,&local_9e0,&local_9f0);
      defs[3].requirements = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_fd8,"xz",&local_101e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,"layout(local_size_x_id = ${ID}) in;",&local_101f);
      local_ca0._0_4_ = 1;
      std::__cxx11::string::string((string *)&local_c98,(string *)&local_a10);
      local_c78 = 4;
      local_c70.m_data = 3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a30,"layout(local_size_z_id = ${ID}) in;",&local_1020);
      local_cd8._0_4_ = 2;
      std::__cxx11::string::string((string *)&local_cd0,(string *)&local_a30);
      local_cb0 = 4;
      local_ca8.m_data = 9;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_f78,(SpecConstant *)local_ca0,(SpecConstant *)local_cd8);
      defs[4].ssboSize = 0x10;
      std::__cxx11::string::string(local_f80,(string *)&group_3);
      std::__cxx11::string::string(local_f88,(string *)&globalDecl);
      std::__cxx11::string::string(local_f90,(string *)&testGroup);
      local_a40.size = 4;
      local_a40.offset = 0;
      local_a40.value.m_data = 3;
      local_a50.size = 4;
      local_a50.offset = 4;
      local_a50.value.m_data = 1;
      local_a60.size = 4;
      local_a60.offset = 8;
      local_a60.value.m_data = 9;
      local_a70.size = 4;
      local_a70.offset = 0xc;
      local_a70.value.m_data = 0x1b;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (__return_storage_ptr___01,&local_a40,&local_a50,&local_a60,&local_a70);
      defs[4].requirements = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_fe0,"yz",&local_1021);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a0,"layout(local_size_y_id = ${ID}) in;",&local_1022);
      local_bf8._0_4_ = 1;
      std::__cxx11::string::string((string *)(local_bf8 + 8),(string *)&local_8a0);
      local_bd0 = 4;
      local_bc8.m_data = 2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"layout(local_size_z_id = ${ID}) in;",&local_1023);
      local_aa8._0_4_ = 2;
      std::__cxx11::string::string((string *)(local_aa8 + 8),(string *)&local_8c0);
      local_a80 = 4;
      local_a78.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&local_228,(SpecConstant *)local_bf8,(SpecConstant *)local_aa8);
      local_210 = 0x10;
      std::__cxx11::string::string(local_208,(string *)&group_3);
      std::__cxx11::string::string(local_1e8,(string *)&globalDecl);
      std::__cxx11::string::string(local_1c8,(string *)&testGroup);
      local_ab8.size = 4;
      local_ab8.offset = 0;
      local_ab8.value.m_data = 1;
      local_8d0.size = 4;
      local_8d0.offset = 4;
      local_8d0.value.m_data = 2;
      local_8e0.size = 4;
      local_8e0.offset = 8;
      local_8e0.value.m_data = 5;
      local_8f0.size = 4;
      local_8f0.offset = 0xc;
      local_8f0.value.m_data = 10;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_b18,&local_ab8,&local_8d0,&local_8e0,&local_8f0);
      local_190 = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_188,"xyz",&local_1024);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testGroup_3,"layout(local_size_x_id = ${ID}) in;",&local_1025);
      local_c30._0_4_ = 1;
      std::__cxx11::string::string((string *)(local_c30 + 8),(string *)&testGroup_3);
      local_c08 = 4;
      local_c00.m_data = 3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"layout(local_size_y_id = ${ID}) in;",&local_ef9);
      local_b90._0_4_ = 2;
      std::__cxx11::string::string((string *)&local_b88,(string *)&local_910);
      local_b68 = 4;
      local_b60.m_data = 5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testGroup_1,"layout(local_size_z_id = ${ID}) in;",&local_efa);
      compositeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)
                   CONCAT44(compositeTests.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data.ptr._4_4_,3);
      std::__cxx11::string::string
                ((string *)
                 &compositeTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(string *)&testGroup_1);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&local_168,(SpecConstant *)local_c30,(SpecConstant *)local_b90,
                 (SpecConstant *)&compositeTests);
      local_150 = 0x10;
      std::__cxx11::string::string(local_148,(string *)&group_3);
      std::__cxx11::string::string(local_128,(string *)&globalDecl);
      std::__cxx11::string::string(local_108,(string *)&testGroup);
      local_920.size = 4;
      local_920.offset = 0;
      local_920.value.m_data = 3;
      local_930.size = 4;
      local_930.offset = 4;
      local_930.value.m_data = 5;
      local_940.size = 4;
      local_940.offset = 8;
      local_940.value.m_data = 7;
      local_950.size = 4;
      local_950.offset = 0xc;
      local_950.value.m_data = 0x69;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (&local_e8,&local_920,&local_930,&local_940,&local_950);
      local_d0 = 0;
      std::__cxx11::string::~string
                ((string *)
                 &compositeTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      std::__cxx11::string::~string((string *)&testGroup_1);
      std::__cxx11::string::~string((string *)&local_b88);
      std::__cxx11::string::~string((string *)&local_910);
      std::__cxx11::string::~string((string *)(local_c30 + 8));
      std::__cxx11::string::~string((string *)&testGroup_3);
      std::__cxx11::string::~string((string *)(local_aa8 + 8));
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)(local_bf8 + 8));
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_cd0);
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_c98);
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::~string
                ((string *)
                 &testGroup_2.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      std::__cxx11::string::~string((string *)local_9b0);
      std::__cxx11::string::~string
                ((string *)
                 &group_2.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)local_970);
      std::__cxx11::string::~string((string *)(local_880 + 8));
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string
                ((string *)
                 &group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      std::__cxx11::string::~string((string *)local_b58);
      for (lVar12 = 0;
          pTVar6 = testGroup_4.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, lVar12 != 0x540; lVar12 = lVar12 + 0xc0) {
        pSVar5 = (SpecConstantTest *)operator_new(0x138);
        anon_unknown_0::SpecConstantTest::SpecConstantTest
                  (pSVar5,testCtx,VK_SHADER_STAGE_COMPUTE_BIT,
                   (CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
        tcu::TestNode::addChild(&pTVar6->super_TestNode,(TestNode *)pSVar5);
      }
      testGroup_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      lVar12 = 0x480;
      do {
        anon_unknown_0::CaseDefinition::~CaseDefinition
                  ((CaseDefinition *)((long)&defs[0].name._M_dataplus._M_p + lVar12));
        lVar12 = lVar12 + -0xc0;
      } while (lVar12 != -0xc0);
      std::__cxx11::string::~string((string *)&testGroup);
      std::__cxx11::string::~string((string *)&globalDecl);
      std::__cxx11::string::~string((string *)&group_3);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&testGroup_4.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,&pTVar6->super_TestNode);
    }
    pTVar3 = stageGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    stageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild(&local_e80->parentGroup->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&stageGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  allTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&local_790);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&allTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
            );
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> allTests (new tcu::TestCaseGroup(testCtx, "spec_constant", "Specialization constants tests"));
	de::MovePtr<tcu::TestCaseGroup> graphicsGroup (new tcu::TestCaseGroup(testCtx, "graphics", ""));

	struct StageDef
	{
		tcu::TestCaseGroup*		parentGroup;
		const char*				name;
		VkShaderStageFlagBits	stage;
	};

	const StageDef stages[] =
	{
		{ graphicsGroup.get(),	"vertex",		VK_SHADER_STAGE_VERTEX_BIT					},
		{ graphicsGroup.get(),	"fragment",		VK_SHADER_STAGE_FRAGMENT_BIT				},
		{ graphicsGroup.get(),	"tess_control",	VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT	},
		{ graphicsGroup.get(),	"tess_eval",	VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT	},
		{ graphicsGroup.get(),	"geometry",		VK_SHADER_STAGE_GEOMETRY_BIT				},
		{ allTests.get(),		"compute",		VK_SHADER_STAGE_COMPUTE_BIT					},
	};

	allTests->addChild(graphicsGroup.release());

	for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(stages); ++stageNdx)
	{
		const StageDef& stage = stages[stageNdx];
		de::MovePtr<tcu::TestCaseGroup> stageGroup (new tcu::TestCaseGroup(testCtx, stage.name, ""));

		stageGroup->addChild(createDefaultValueTests       (testCtx, stage.stage));
		stageGroup->addChild(createBasicSpecializationTests(testCtx, stage.stage));
		stageGroup->addChild(createBuiltInOverrideTests    (testCtx, stage.stage));
		stageGroup->addChild(createExpressionTests         (testCtx, stage.stage));
		stageGroup->addChild(createCompositeTests          (testCtx, stage.stage));

		if (stage.stage == VK_SHADER_STAGE_COMPUTE_BIT)
			stageGroup->addChild(createWorkGroupSizeTests(testCtx));

		stage.parentGroup->addChild(stageGroup.release());
	}

	return allTests.release();
}